

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  int in_ECX;
  allocator<char> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  Value *in_stack_ffffffffffffff50;
  allocator<char> *__end;
  char *in_stack_ffffffffffffff58;
  char *__beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [64];
  
  if (in_ECX == 1) {
    __beg = *(char **)(in_RDI + 0xe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (in_RSI,__beg,(char *)in_stack_ffffffffffffff50,
               (allocator<char> *)in_stack_ffffffffffffff48);
    Value::setComment(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                      (CommentPlacement)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    __end = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char *)__end,in_RDX);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0xe8),local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return;
}

Assistant:

void
Reader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(std::string(begin, end), placement);
  } else {
    commentsBefore_ += std::string(begin, end);
  }
}